

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O2

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::VerifyBumpAllocated
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,char *bumpAllocateAddress)

{
  Recycler *this_00;
  char *address;
  bool bVar1;
  byte *pbVar2;
  uint i;
  uint index;
  char *address_00;
  
  address_00 = (this->super_HeapBlock).address;
  this_00 = this->heapBucket->heapInfo->recycler;
  for (index = 0; index < this->objectCount; index = index + 1) {
    if (address_00 < bumpAllocateAddress) {
      Recycler::VerifyCheckPad(this_00,address_00,(ulong)this->objectSize);
      pbVar2 = ObjectInfo(this,index);
      if ((char)*pbVar2 < '\0') {
        bVar1 = HeapBlock::IsAnyFinalizableBlock(&this->super_HeapBlock);
        if (!bVar1) {
          address = (this->super_HeapBlock).address;
          pbVar2 = ObjectInfo(this,index);
          Recycler::VerifyCheck
                    (0,L"Non-Finalizable block should not have finalizable objects",address,pbVar2);
        }
      }
    }
    else {
      Recycler::VerifyCheckFill(address_00 + 8,(ulong)this->objectSize - 8);
    }
    address_00 = address_00 + this->objectSize;
  }
  return;
}

Assistant:

void SmallHeapBlockT<TBlockAttributes>::VerifyBumpAllocated(_In_ char * bumpAllocateAddress)
{
    ushort verifyFinalizeCount = 0;
    Recycler * recycler = this->heapBucket->heapInfo->recycler;
    char * memBlock = this->GetAddress();
    for (uint i = 0; i < objectCount; i++)
    {
        if (memBlock >= bumpAllocateAddress)
        {
            Recycler::VerifyCheckFill(memBlock + sizeof(FreeObject), this->GetObjectSize() - sizeof(FreeObject));
        }
        else
        {
            recycler->VerifyCheckPad(memBlock, this->GetObjectSize());
            if ((this->ObjectInfo(i) & FinalizeBit) != 0)
            {
                if (this->IsAnyFinalizableBlock())
                {
                    verifyFinalizeCount++;
                }
                else
                {
                    Recycler::VerifyCheck(false, _u("Non-Finalizable block should not have finalizable objects"),
                        this->GetAddress(), &this->ObjectInfo(i));
                }
            }
        }
        memBlock += this->GetObjectSize();
    }
}